

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int __thiscall ncnn::GRU::load_model(GRU *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  void *local_78;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  uVar4 = (this->direction == 2) + 1;
  uVar3 = (long)this->weight_data_size / (long)(int)uVar4;
  uVar3 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
          (long)this->num_output;
  (*mb->_vptr_ModelBin[4])
            (&local_78,mb,
             (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 3 & 0xffffffff
             ,(ulong)(uint)(this->num_output * 3),(ulong)uVar4,0);
  if (&this->weight_xc_data != (Mat *)&local_78) {
    if (local_70 != (int *)0x0) {
      LOCK();
      *local_70 = *local_70 + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_xc_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->weight_xc_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->weight_xc_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_xc_data).data = local_78;
    (this->weight_xc_data).refcount = local_70;
    (this->weight_xc_data).elemsize = local_68;
    (this->weight_xc_data).elempack = local_60;
    (this->weight_xc_data).allocator = local_58;
    (this->weight_xc_data).dims = local_50;
    (this->weight_xc_data).w = iStack_4c;
    (this->weight_xc_data).h = iStack_48;
    (this->weight_xc_data).d = iStack_44;
    (this->weight_xc_data).c = local_40;
    (this->weight_xc_data).cstep = local_38;
  }
  if (local_70 != (int *)0x0) {
    LOCK();
    *local_70 = *local_70 + -1;
    UNLOCK();
    if (*local_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        free(local_78);
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = -100;
  if (((this->weight_xc_data).data != (void *)0x0) &&
     ((long)(this->weight_xc_data).c * (this->weight_xc_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[4])(&local_78,mb,(ulong)(uint)this->num_output,4,(ulong)uVar4,0);
    if (&this->bias_c_data != (Mat *)&local_78) {
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + 1;
        UNLOCK();
      }
      piVar1 = (this->bias_c_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pAVar2 = (this->bias_c_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bias_c_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_c_data).data = local_78;
      (this->bias_c_data).refcount = local_70;
      (this->bias_c_data).elemsize = local_68;
      (this->bias_c_data).elempack = local_60;
      (this->bias_c_data).allocator = local_58;
      (this->bias_c_data).dims = local_50;
      (this->bias_c_data).w = iStack_4c;
      (this->bias_c_data).h = iStack_48;
      (this->bias_c_data).d = iStack_44;
      (this->bias_c_data).c = local_40;
      (this->bias_c_data).cstep = local_38;
    }
    if (local_70 != (int *)0x0) {
      LOCK();
      *local_70 = *local_70 + -1;
      UNLOCK();
      if (*local_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(local_78);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->bias_c_data).data != (void *)0x0) &&
       ((long)(this->bias_c_data).c * (this->bias_c_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[4])
                (&local_78,mb,(ulong)(uint)this->num_output,(ulong)(uint)(this->num_output * 3),
                 (ulong)uVar4,0);
      if (&this->weight_hc_data != (Mat *)&local_78) {
        if (local_70 != (int *)0x0) {
          LOCK();
          *local_70 = *local_70 + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_hc_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->weight_hc_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->weight_hc_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_hc_data).data = local_78;
        (this->weight_hc_data).refcount = local_70;
        (this->weight_hc_data).elemsize = local_68;
        (this->weight_hc_data).elempack = local_60;
        (this->weight_hc_data).allocator = local_58;
        (this->weight_hc_data).dims = local_50;
        (this->weight_hc_data).w = iStack_4c;
        (this->weight_hc_data).h = iStack_48;
        (this->weight_hc_data).d = iStack_44;
        (this->weight_hc_data).c = local_40;
        (this->weight_hc_data).cstep = local_38;
      }
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + -1;
        UNLOCK();
        if (*local_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            free(local_78);
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if ((((this->weight_hc_data).data != (void *)0x0) &&
          ((long)(this->weight_hc_data).c * (this->weight_hc_data).cstep != 0)) &&
         (iVar5 = 0, this->int8_scale_term != 0)) {
        (*mb->_vptr_ModelBin[3])(&local_78,mb,(ulong)(uint)(this->num_output * 3),(ulong)uVar4,1);
        if (&this->weight_xc_data_int8_scales != (Mat *)&local_78) {
          if (local_70 != (int *)0x0) {
            LOCK();
            *local_70 = *local_70 + 1;
            UNLOCK();
          }
          piVar1 = (this->weight_xc_data_int8_scales).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = (this->weight_xc_data_int8_scales).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                free((this->weight_xc_data_int8_scales).data);
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_xc_data_int8_scales).data = local_78;
          (this->weight_xc_data_int8_scales).refcount = local_70;
          (this->weight_xc_data_int8_scales).elemsize = local_68;
          (this->weight_xc_data_int8_scales).elempack = local_60;
          (this->weight_xc_data_int8_scales).allocator = local_58;
          (this->weight_xc_data_int8_scales).dims = local_50;
          (this->weight_xc_data_int8_scales).w = iStack_4c;
          (this->weight_xc_data_int8_scales).h = iStack_48;
          (this->weight_xc_data_int8_scales).d = iStack_44;
          (this->weight_xc_data_int8_scales).c = local_40;
          (this->weight_xc_data_int8_scales).cstep = local_38;
        }
        if (local_70 != (int *)0x0) {
          LOCK();
          *local_70 = *local_70 + -1;
          UNLOCK();
          if (*local_70 == 0) {
            if (local_58 == (Allocator *)0x0) {
              free(local_78);
            }
            else {
              (*local_58->_vptr_Allocator[3])();
            }
          }
        }
        (*mb->_vptr_ModelBin[3])(&local_78,mb,(ulong)(uint)(this->num_output * 3),(ulong)uVar4,1);
        if (&this->weight_hc_data_int8_scales != (Mat *)&local_78) {
          if (local_70 != (int *)0x0) {
            LOCK();
            *local_70 = *local_70 + 1;
            UNLOCK();
          }
          piVar1 = (this->weight_hc_data_int8_scales).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = (this->weight_hc_data_int8_scales).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                free((this->weight_hc_data_int8_scales).data);
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_hc_data_int8_scales).data = local_78;
          (this->weight_hc_data_int8_scales).refcount = local_70;
          (this->weight_hc_data_int8_scales).elemsize = local_68;
          (this->weight_hc_data_int8_scales).elempack = local_60;
          (this->weight_hc_data_int8_scales).allocator = local_58;
          (this->weight_hc_data_int8_scales).dims = local_50;
          (this->weight_hc_data_int8_scales).w = iStack_4c;
          (this->weight_hc_data_int8_scales).h = iStack_48;
          (this->weight_hc_data_int8_scales).d = iStack_44;
          (this->weight_hc_data_int8_scales).c = local_40;
          (this->weight_hc_data_int8_scales).cstep = local_38;
        }
        if (local_70 != (int *)0x0) {
          LOCK();
          *local_70 = *local_70 + -1;
          UNLOCK();
          if (*local_70 == 0) {
            if (local_58 == (Allocator *)0x0) {
              free(local_78);
            }
            else {
              (*local_58->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int GRU::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output / 3;

    // raw weight data
    weight_xc_data = mb.load(size, num_output * 3, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output * 3, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_xc_data_int8_scales = mb.load(num_output * 3, num_directions, 1);
        weight_hc_data_int8_scales = mb.load(num_output * 3, num_directions, 1);
    }
#endif // NCNN_INT8

    return 0;
}